

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
TempBanGameCommand::trigger
          (TempBanGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  const_pointer begin;
  const_pointer pvVar4;
  size_type sVar5;
  rep rVar6;
  duration<long,_std::ratio<1L,_1L>_> *pdVar7;
  basic_string_view<char,_std::char_traits<char>_> *in_whitespace;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  __sv_type _Var8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  size_t local_1f0;
  char *local_1e8;
  size_t local_1e0;
  char *local_1d8;
  size_t local_1b8;
  char *local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  string_view local_188;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  __sv_type local_148;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  size_t local_108;
  size_t local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_e8;
  duration<long,_std::ratio<1L,_1L>_> local_c8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_c0;
  rep local_b0;
  size_t local_a8;
  char *local_a0;
  PlayerInfo *target;
  string_view reason;
  seconds duration;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> *local_60;
  basic_string_view<char,_std::char_traits<char>_> *local_58;
  undefined1 local_50 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  PlayerInfo *player_local;
  Server *source_local;
  TempBanGameCommand *this_local;
  string_view parameters_local;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_str;
  in_whitespace = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len;
  local_60 = in_whitespace;
  local_58 = args_2;
  split_parameters.second._M_str = (char *)player;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&name._M_str," \t");
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_50,(jessilib *)&local_60,
             (basic_string_view<char,_std::char_traits<char>_> *)&name._M_str,in_whitespace);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  pcVar1 = split_parameters.second._M_str;
  if (bVar3) {
    bVar9 = sv("Error: Too few parameters. Syntax: tban [Duration] <player> [Reason]",0x44);
    local_1f0 = bVar9._M_len;
    local_1e8 = bVar9._M_str;
    RenX::Server::sendMessage(source,pcVar1,local_1f0,local_1e8);
  }
  else {
    duration.__r = (rep)local_50;
    name._M_len = split_parameters.first._M_len;
    reason._M_str = (char *)RenX_CommandsPlugin::getDefaultTBanTime(&pluginInstance);
    target = (PlayerInfo *)split_parameters.first._M_str;
    reason._M_len = split_parameters.second._M_len;
    local_b0 = duration.__r;
    local_a8 = name._M_len;
    local_a0 = (char *)RenX::Server::getPlayerByPartName(source,duration.__r,name._M_len);
    if ((local_a0 == (char *)0x0) &&
       (bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &split_parameters.first._M_str), !bVar3)) {
      begin = std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)&duration);
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&duration);
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&duration);
      local_c0 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                           (begin,pvVar4 + sVar5);
      reason._M_str = (char *)local_c0.duration.__r;
      rVar6 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                        ((duration<long,_std::ratio<1L,_1L>_> *)&reason._M_str);
      if (0 < rVar6) {
        local_c8.__r = (rep)RenX_CommandsPlugin::getMaxTBanTime(&pluginInstance);
        pdVar7 = std::min<std::chrono::duration<long,std::ratio<1l,1l>>>
                           ((duration<long,_std::ratio<1L,_1L>_> *)&reason._M_str,&local_c8);
        reason._M_str = (char *)pdVar7->__r;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8," \t");
        jessilib::
        word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_e8,(jessilib *)&split_parameters.first._M_str,&local_f8,in_whitespace);
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::operator=((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)local_50,&local_e8);
        duration.__r = (rep)local_50;
        name._M_len = split_parameters.first._M_len;
        target = (PlayerInfo *)split_parameters.first._M_str;
        reason._M_len = split_parameters.second._M_len;
        local_108 = (size_t)local_50;
        local_100 = split_parameters.first._M_len;
        local_a0 = (char *)RenX::Server::getPlayerByPartName
                                     (source,local_50,split_parameters.first._M_len);
      }
    }
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&target);
    if (bVar3) {
      local_118 = sv("No reason",9);
      target = (PlayerInfo *)local_118._M_len;
      reason._M_len = (size_t)local_118._M_str;
    }
    pcVar2 = split_parameters.second._M_str;
    pcVar1 = local_a0;
    if (local_a0 == (char *)0x0) {
      local_128 = sv("Error: Player not found.",0x18);
      RenX::Server::sendMessage(source,pcVar2,local_128._M_len,local_128._M_str);
    }
    else if (split_parameters.second._M_str == local_a0) {
      local_138 = sv("Error: You can\'t ban yourself.",0x1e);
      RenX::Server::sendMessage(source,pcVar2,local_138._M_len,local_138._M_str);
    }
    else if (*(int *)(local_a0 + 0x1b0) < *(int *)(split_parameters.second._M_str + 0x1b0)) {
      _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(split_parameters.second._M_str + 8));
      local_1b8 = _Var8._M_len;
      local_1b0 = _Var8._M_str;
      RenX::Server::banPlayer(source,pcVar1,local_1b8,local_1b0,target,reason._M_len,reason._M_str);
      pcVar1 = split_parameters.second._M_str;
      bVar9 = sv("Player has been temporarily banned and kicked from the game.",0x3c);
      local_1e0 = bVar9._M_len;
      local_1d8 = bVar9._M_str;
      RenX::Server::sendMessage(source,pcVar1,local_1e0,local_1d8);
    }
    else {
      local_178 = sv("Error: You can\'t ban higher level ",0x22);
      local_188 = RenX_CommandsPlugin::getStaffTitle(&pluginInstance);
      local_198 = sv("s.",2);
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (&local_168,(jessilib *)&local_178,&local_188,&local_198,args_2);
      local_148 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_168);
      RenX::Server::sendMessage(source,pcVar2,local_148._M_len,local_148._M_str);
      std::__cxx11::string::~string((string *)&local_168);
    }
  }
  return;
}

Assistant:

void TempBanGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.first.empty()) {
		std::string_view name = split_parameters.first;
		std::chrono::seconds duration = pluginInstance.getDefaultTBanTime();
		std::string_view reason = split_parameters.second;

		RenX::PlayerInfo *target = source->getPlayerByPartName(name);
		if (target == nullptr
			&& !split_parameters.second.empty()) {
			// Try reading first token as duration
			duration = jessilib::duration_from_string(name.data(), name.data() + name.size()).duration;
			if (duration.count() > 0) {
				duration = std::min(duration, pluginInstance.getMaxTBanTime());
				split_parameters = jessilib::word_split_once_view(split_parameters.second, WHITESPACE_SV);
				name = split_parameters.first;
				reason = split_parameters.second;
				target = source->getPlayerByPartName(name);
			}
		}

		if (reason.empty()) {
			reason = "No reason"sv;
		}

		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (player == target)
			source->sendMessage(*player, "Error: You can't ban yourself."sv);
		else if (target->access >= player->access)
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can't ban higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		else
		{
			source->banPlayer(*target, player->name, reason, duration);
			source->sendMessage(*player, "Player has been temporarily banned and kicked from the game."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: tban [Duration] <player> [Reason]"sv);
}